

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* prmon::cmd_pipe_output
            (pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *cmdargs)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  int iVar2;
  __pid_t __pid;
  size_t i;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  char **__argv;
  long lVar5;
  ostream *poVar6;
  int *piVar7;
  pointer pbVar8;
  long lVar9;
  int fd [2];
  int status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string output;
  char buffer [100];
  
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->first = 0;
  pvVar1 = &__return_storage_ptr__->second;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1,&local_d8);
  iVar2 = pipe(fd);
  if (iVar2 == -1) {
    __return_storage_ptr__->first = 2;
  }
  else {
    __pid = fork();
    if (__pid < 0) {
      __return_storage_ptr__->first = 3;
    }
    else {
      local_e0 = pvVar1;
      if (__pid == 0) {
        close(fd[0]);
        dup2(fd[1],1);
        dup2(fd[1],2);
        pbVar8 = (cmdargs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (pbVar8->_M_dataplus)._M_p;
        lVar9 = (long)(cmdargs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
        __argv = (char **)malloc((lVar9 >> 2) + 8);
        if (__argv != (char **)0x0) {
          lVar9 = lVar9 >> 5;
          for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
            __argv[lVar5] = (pbVar8->_M_dataplus)._M_p;
            pbVar8 = pbVar8 + 1;
          }
          __argv[lVar9] = (char *)0x0;
          execvp(pcVar3,__argv);
          poVar6 = std::operator<<((ostream *)&std::cerr,"Exec ERROR: ");
          piVar7 = __errno_location();
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*piVar7);
          std::endl<char,std::char_traits<char>>(poVar6);
          free(__argv);
        }
        exit(1);
      }
      close(fd[1]);
      __stream = fdopen(fd[0],"r");
      while( true ) {
        pcVar3 = fgets(buffer,100,__stream);
        pvVar1 = local_e0;
        if (pcVar3 == (char *)0x0) break;
        sVar4 = strlen(buffer);
        if ((sVar4 == 0) || (buffer[sVar4 - 1] != '\n')) {
          std::__cxx11::string::append((char *)&output);
        }
        else {
          buffer[sVar4 - 1] = '\0';
          std::__cxx11::string::append((char *)&output);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_d8,&output);
          output._M_string_length = 0;
          *output._M_dataplus._M_p = '\0';
        }
      }
      if (output._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_d8,&output);
      }
      fclose(__stream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_d8);
      status = 0;
      waitpid(__pid,&status,0);
      if (status != 0) {
        __return_storage_ptr__->first = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

const std::pair<int, std::vector<std::string>> prmon::cmd_pipe_output(
    const std::vector<std::string> cmdargs) {
  std::vector<std::string> split_output{};
  std::string output;
  std::pair<int, std::vector<std::string>> ret{0, split_output};

  int fd[2];
  if (pipe(fd) == -1) {
    // Pipe failed
    ret.first = 2;
    return ret;
  }

  pid_t p;
  p = fork();
  if (p < 0) {
    // Fork failed
    ret.first = 3;
    return ret;
  }

  if (p > 0) {
    // Parent
    close(fd[1]);
  } else {
    // Child
    close(fd[0]);
    dup2(fd[1], STDOUT_FILENO);
    dup2(fd[1], STDERR_FILENO);

    // Construct the c-ish char*s needed for execvp
    const char* cmd = cmdargs[0].c_str();
    char** argv = (char**)malloc((cmdargs.size() + 1) * sizeof(char*));
    if (!argv) exit(EXIT_FAILURE);
    for (size_t i = 0; i < cmdargs.size(); ++i) {
      argv[i] = (char*)cmdargs[i].c_str();
    }
    argv[cmdargs.size()] = NULL;

    execvp(cmd, argv);
    // If we got here then something went wrong and exec failed
    // need to signal this back to our parent
    std::cerr << "Exec ERROR: " << errno << std::endl;
    free(argv);
    exit(EXIT_FAILURE);
    // Child
  }

  // Read the output from the executed command and collect
  // it into the output vector of strings
  const size_t buf_len = 100;
  char buffer[buf_len];
  FILE* inp = fdopen(fd[0], "r");
  while (fgets(buffer, buf_len, inp) != NULL) {
    // fgets stops on newlines, so use that to help split
    // the output into the vector of strings
    if ((strlen(buffer) > 0) && (buffer[strlen(buffer) - 1] == '\n')) {
      buffer[strlen(buffer) - 1] = '\0';
      output.append(buffer);
      split_output.push_back(output);
      output.clear();
    } else {
      output.append(buffer);
    }
  }
  if (!output.empty()) {
    split_output.push_back(output);
  }
  fclose(inp);
  ret.second = split_output;

  int status = 0;
  waitpid(p, &status, 0);
  if (status) {
    // Something went wrong in childland...
    ret.first = 1;
    return ret;
  }

  return ret;
}